

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::XmlWriter::writeStylesheetRef(XmlWriter *this,string *url)

{
  ostream *poVar1;
  
  poVar1 = this->m_os;
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"<?xml-stylesheet type=\"text/xsl\" href=\"",0x27);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(url->_M_dataplus)._M_p,url->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\"?>\n",4);
  return;
}

Assistant:

void XmlWriter::writeStylesheetRef( std::string const& url ) {
        m_os << "<?xml-stylesheet type=\"text/xsl\" href=\"" << url << "\"?>\n";
    }